

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O0

SingleAttribute<avro::Name> * avro::asSingleAttribute<avro::Name>(Name *t)

{
  Name *in_RDI;
  SingleAttribute<avro::Name> *n;
  Name *this;
  
  this = in_RDI;
  concepts::SingleAttribute<avro::Name>::SingleAttribute((SingleAttribute<avro::Name> *)0x23a524);
  concepts::SingleAttribute<avro::Name>::add((SingleAttribute<avro::Name> *)this,in_RDI);
  return (SingleAttribute<avro::Name> *)in_RDI;
}

Assistant:

concepts::SingleAttribute<T> asSingleAttribute(const T& t)
{
    concepts::SingleAttribute<T> n;
    n.add(t);
    return n;
}